

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_latpath_t * ps_astar_next(ps_astar_t *nbest)

{
  float fVar1;
  int32 w2;
  int32 w1;
  ps_lattice_t *ppVar2;
  ps_latnode_t *ppVar3;
  ps_latnode_t *ppVar4;
  ps_latlink_t *ppVar5;
  ngram_model_t *model;
  int iVar6;
  ps_latpath_t *newpath;
  ps_latpath_s *ppVar7;
  latlink_list_t *plVar8;
  int32 local_34;
  
  ppVar2 = nbest->dag;
  ppVar7 = nbest->path_list;
  nbest->top = ppVar7;
  if (ppVar7 != (ps_latpath_s *)0x0) {
    do {
      nbest->path_list = ppVar7->next;
      if (ppVar7 == nbest->path_tail) {
        nbest->path_tail = (ps_latpath_t *)0x0;
      }
      nbest->n_path = nbest->n_path + -1;
      ppVar3 = ppVar7->node;
      iVar6 = nbest->ef;
      if (iVar6 <= ppVar3->sf) {
        return ppVar7;
      }
      ppVar4 = ppVar2->end;
      if ((ppVar3 == ppVar4) && (ppVar4->sf < iVar6)) {
        return ppVar7;
      }
      if (ppVar3->fef < iVar6) {
        for (plVar8 = ppVar3->exits; plVar8 != (latlink_list_t *)0x0; plVar8 = plVar8->next) {
          if (-0x20000000 < (plVar8->link->to->info).fanin) {
            newpath = (ps_latpath_t *)
                      __listelem_malloc__(nbest->latpath_alloc,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                          ,0x68a);
            ppVar5 = plVar8->link;
            ppVar3 = ppVar5->to;
            newpath->node = ppVar3;
            newpath->parent = ppVar7;
            newpath->score = ppVar5->ascr + ppVar7->score;
            model = nbest->lmset;
            if (model != (ngram_model_t *)0x0) {
              fVar1 = (float)nbest->lwf;
              w2 = ppVar3->basewid;
              w1 = ppVar7->node->basewid;
              if (ppVar7->parent == (ps_latpath_s *)0x0) {
                iVar6 = ngram_bg_score(model,w2,w1,&local_34);
              }
              else {
                iVar6 = ngram_tg_score(model,w2,w1,ppVar7->parent->node->basewid,&local_34);
              }
              newpath->score = (int)((float)newpath->score + fVar1 * (float)(iVar6 >> 10));
            }
            nbest->n_hyp_tried = nbest->n_hyp_tried + 1;
            iVar6 = (newpath->node->info).fanin + newpath->score;
            if ((nbest->n_path < 500) ||
               ((nbest->path_tail->node->info).fanin + nbest->path_tail->score <= iVar6)) {
              path_insert(nbest,newpath,iVar6);
            }
            else {
              __listelem_free__(nbest->latpath_alloc,newpath,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                ,0x6a7);
              nbest->n_hyp_reject = nbest->n_hyp_reject + 1;
            }
          }
        }
      }
      ppVar7 = nbest->path_list;
      nbest->top = ppVar7;
    } while (ppVar7 != (ps_latpath_s *)0x0);
  }
  return (ps_latpath_t *)0x0;
}

Assistant:

ps_latpath_t *
ps_astar_next(ps_astar_t *nbest)
{
    ps_lattice_t *dag;

    dag = nbest->dag;

    /* Pop the top (best) partial hypothesis */
    while ((nbest->top = nbest->path_list) != NULL) {
        nbest->path_list = nbest->path_list->next;
        if (nbest->top == nbest->path_tail)
            nbest->path_tail = NULL;
        nbest->n_path--;

        /* Complete hypothesis? */
        if ((nbest->top->node->sf >= nbest->ef)
            || ((nbest->top->node == dag->end) &&
                (nbest->ef > dag->end->sf))) {
            /* FIXME: Verify that it is non-empty.  Also we may want
             * to verify that it is actually distinct from other
             * paths, since often this is not the case*/
            return nbest->top;
        }
        else {
            if (nbest->top->node->fef < nbest->ef)
                path_extend(nbest, nbest->top);
        }
    }

    /* Did not find any more paths to extend. */
    return NULL;
}